

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

int __thiscall
glslang::HlslParseContext::findSubtreeOffset
          (HlslParseContext *this,TType *type,int subset,TVector<int> *offsets)

{
  uint uVar1;
  int iVar2;
  const_reference pvVar3;
  undefined1 local_c8 [8];
  TType derefType;
  TVector<int> *offsets_local;
  int subset_local;
  TType *type_local;
  HlslParseContext *this_local;
  
  derefType.spirvType = (TSpirvType *)offsets;
  uVar1 = (*type->_vptr_TType[0x1d])();
  if (((uVar1 & 1) == 0) && (uVar1 = (*type->_vptr_TType[0x25])(), (uVar1 & 1) == 0)) {
    pvVar3 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                       ((vector<int,_glslang::pool_allocator<int>_> *)derefType.spirvType,
                        (long)subset);
    return *pvVar3;
  }
  TType::TType((TType *)local_c8,type,0,false);
  pvVar3 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                     ((vector<int,_glslang::pool_allocator<int>_> *)derefType.spirvType,(long)subset
                     );
  iVar2 = findSubtreeOffset(this,(TType *)local_c8,*pvVar3,(TVector<int> *)derefType.spirvType);
  TType::~TType((TType *)local_c8);
  return iVar2;
}

Assistant:

int HlslParseContext::findSubtreeOffset(const TType& type, int subset, const TVector<int>& offsets) const
{
    if (!type.isArray() && !type.isStruct())
        return offsets[subset];
    TType derefType(type, 0);
    return findSubtreeOffset(derefType, offsets[subset], offsets);
}